

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optCompare_optEmptyNullopt_Test::~optCompare_optEmptyNullopt_Test
          (optCompare_optEmptyNullopt_Test *this)

{
  optCompare_optEmptyNullopt_Test *this_local;
  
  ~optCompare_optEmptyNullopt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(optCompare, optEmptyNullopt)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i;
  EXPECT_TRUE(i == nullopt);
  EXPECT_FALSE(i != nullopt);
  EXPECT_FALSE(i < nullopt);
  EXPECT_FALSE(i > nullopt);
  EXPECT_TRUE(i <= nullopt);
  EXPECT_TRUE(i >= nullopt);
}